

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Floating::WithinAbsMatcher::WithinAbsMatcher
          (WithinAbsMatcher *this,double target,double margin)

{
  ReusableStringStream *pRVar1;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  char (*in_stack_ffffffffffffff78) [32];
  MatcherBase<double> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  Impl::MatcherBase<double>::MatcherBase(in_stack_ffffffffffffff80);
  *in_RDI = &PTR__WithinAbsMatcher_00343f08;
  in_RDI[5] = &DAT_00343f38;
  in_RDI[6] = in_XMM0_Qa;
  in_RDI[7] = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) < 0.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff80,
               (char (*) [17])in_stack_ffffffffffffff78);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff78
              );
    uVar2 = CONCAT13(0x2e,(int3)in_stack_ffffffffffffffa0);
    pRVar1 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)in_stack_ffffffffffffff80,*in_stack_ffffffffffffff78
                       );
    pRVar1 = ReusableStringStream::operator<<(pRVar1,in_stack_ffffffffffffff78);
    ReusableStringStream::str_abi_cxx11_(pRVar1);
    throw_domain_error((string *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
  }
  return;
}

Assistant:

WithinAbsMatcher::WithinAbsMatcher(double target, double margin)
        :m_target{ target }, m_margin{ margin } {
        CATCH_ENFORCE(margin >= 0, "Invalid margin: " << margin << '.'
            << " Margin has to be non-negative.");
    }